

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

void __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::put_after_get
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uint64_t hash,
          scored_action *val)

{
  hash_elem *phVar1;
  size_t sVar2;
  hash_elem *phVar3;
  size_t sVar4;
  
  phVar3 = (this->dat)._begin;
  sVar4 = this->last_position;
  if ((phVar3[sVar4].occupied == false) &&
     (phVar1 = (this->dat).end_array, sVar2 = this->num_occupants, this->num_occupants = sVar2 + 1,
     (ulong)((long)phVar1 - (long)phVar3 >> 5) <= sVar2 * 4 + 4)) {
    double_size(this);
    get(this,key,hash);
    phVar3 = (this->dat)._begin;
    sVar4 = this->last_position;
  }
  phVar3[sVar4].occupied = true;
  (this->dat)._begin[this->last_position].key = *key;
  (this->dat)._begin[this->last_position].val = *val;
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }